

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseBitVector.h
# Opt level: O0

BOOLEAN __thiscall
BVSparse<Memory::HeapAllocator>::TestAndClear(BVSparse<Memory::HeapAllocator> *this,BVIndex i)

{
  BOOLEAN BVar1;
  bool bVar2;
  BVIndex index;
  BVSparseNode *pBVar3;
  BOOLEAN bit;
  BVIndex bvIndex;
  BVSparseNode *current;
  Type_conflict *prevNextField;
  BVSparse<Memory::HeapAllocator> *pBStack_18;
  BVIndex i_local;
  BVSparse<Memory::HeapAllocator> *this_local;
  
  current = (BVSparseNode *)0x0;
  prevNextField._4_4_ = i;
  pBStack_18 = this;
  pBVar3 = NodeFromIndex(this,i,(Type_conflict **)&current,false);
  if (pBVar3 == (BVSparseNode *)0x0) {
    this_local._7_1_ = '\0';
  }
  else {
    index = BVUnitT<unsigned_long>::Offset(prevNextField._4_4_);
    BVar1 = BVUnitT<unsigned_long>::Test(&pBVar3->data,index);
    BVUnitT<unsigned_long>::Clear(&pBVar3->data,index);
    bVar2 = BVUnitT<unsigned_long>::IsEmpty(&pBVar3->data);
    this_local._7_1_ = BVar1;
    if (bVar2) {
      pBVar3 = DeleteNode(this,pBVar3,false);
      current->next = pBVar3;
    }
  }
  return this_local._7_1_;
}

Assistant:

BOOLEAN
BVSparse<TAllocator>::TestAndClear(BVIndex i)
{
    Field(BVSparseNode*, TAllocator)* prevNextField = nullptr;
    BVSparseNode * current = this->NodeFromIndex(i, &prevNextField, false /* create */);
    if (current == nullptr)
    {
        return false;
    }
    BVIndex bvIndex = SparseBVUnit::Offset(i);
    BOOLEAN bit = current->data.Test(bvIndex);
    current->data.Clear(bvIndex);
    if (current->data.IsEmpty())
    {
        *prevNextField = this->DeleteNode(current, false);
    }
    return bit;
}